

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

void fiobj_data_copy_parent(FIOBJ o)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  fio_str_info_s local_50;
  ssize_t local_38;
  ssize_t written;
  size_t pos;
  fio_str_info_s data;
  FIOBJ o_local;
  
  data.data = (char *)o;
  if (*(int *)(*(long *)(o + 0x10) + 0x30) == -1) {
    pvVar2 = fio_malloc(*(long *)(o + 0x20) + 1);
    *(void **)(data.data + 8) = pvVar2;
    memcpy(*(void **)(data.data + 8),
           (void *)(*(long *)(*(long *)(data.data + 0x10) + 8) + *(long *)(data.data + 0x18)),
           *(size_t *)(data.data + 0x20));
    *(undefined1 *)(*(long *)(data.data + 8) + *(long *)(data.data + 0x20)) = 0;
    *(undefined8 *)(data.data + 0x18) = *(undefined8 *)(data.data + 0x20);
    data.data[0x30] = -1;
    data.data[0x31] = -1;
    data.data[0x32] = -1;
    data.data[0x33] = -1;
    fiobj_free(*(FIOBJ *)(data.data + 0x10));
    *(code **)(data.data + 0x10) = fio_free;
  }
  else {
    iVar1 = fio_tmpfile();
    *(int *)(data.data + 0x30) = iVar1;
    if (*(int *)(data.data + 0x30) < 0) {
      perror("FATAL ERROR: (fiobj_data) can\'t create temporary file");
      piVar3 = __errno_location();
      exit(*piVar3);
    }
    written = 0;
    do {
      fiobj_data_pread(&local_50,*(FIOBJ *)(data.data + 0x10),written + *(long *)(data.data + 0x18),
                       0x1000);
      pos = local_50.capa;
      data.capa = local_50.len;
      data.len = (size_t)local_50.data;
      if (*(ulong *)(data.data + 0x20) < local_50.len + written) {
        data.capa = *(long *)(data.data + 0x20) - written;
      }
      while (local_38 = write(*(int *)(data.data + 0x30),(void *)data.len,data.capa), local_38 < 0)
      {
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
          perror("FATAL ERROR: (fiobj_data) can\'t write to temporary file");
          piVar3 = __errno_location();
          exit(*piVar3);
        }
      }
      written = local_38 + written;
    } while (data.capa == 0x1000);
    fiobj_free(*(FIOBJ *)(data.data + 0x10));
    data.data[0x18] = '\0';
    data.data[0x19] = '\0';
    data.data[0x1a] = '\0';
    data.data[0x1b] = '\0';
    data.data[0x1c] = '\0';
    data.data[0x1d] = '\0';
    data.data[0x1e] = '\0';
    data.data[0x1f] = '\0';
    *(ssize_t *)(data.data + 0x20) = written;
    *(undefined8 *)(data.data + 0x10) = *(undefined8 *)(data.data + 0x28);
    data.data[0x28] = '\0';
    data.data[0x29] = '\0';
    data.data[0x2a] = '\0';
    data.data[0x2b] = '\0';
    data.data[0x2c] = '\0';
    data.data[0x2d] = '\0';
    data.data[0x2e] = '\0';
    data.data[0x2f] = '\0';
    data.data[8] = '\0';
    data.data[9] = '\0';
    data.data[10] = '\0';
    data.data[0xb] = '\0';
    data.data[0xc] = '\0';
    data.data[0xd] = '\0';
    data.data[0xe] = '\0';
    data.data[0xf] = '\0';
  }
  return;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}